

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O2

void CGL::Misc::draw_sphere(Vector3D *p,double r)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  double local_58;
  double dStack_50;
  double local_48;
  
  if (initialized == '\0') {
    init_mesh();
    initialized = '\x01';
  }
  glMatrixMode(0x1700);
  glPushMatrix();
  glTranslated((p->field_0).field_0.x,(p->field_0).field_0.y,(p->field_0).field_0.z);
  glScaled(r,r,r);
  for (uVar4 = 0; uVar4 < 48000; uVar4 = uVar4 + 3) {
    glBegin(9);
    uVar2 = (ulong)(Indices[uVar4] << 3);
    uVar3 = (ulong)(Indices[uVar4 + 1] << 3);
    uVar5 = (ulong)(Indices[uVar4 + 2] << 3);
    local_48 = Vertices[uVar2 + 4];
    local_58 = Vertices[uVar2 + 2];
    dStack_50 = Vertices[uVar2 + 3];
    local_68 = Vertices[uVar3 + 4];
    local_78 = Vertices[uVar3 + 2];
    dStack_70 = Vertices[uVar3 + 3];
    local_88 = Vertices[uVar5 + 4];
    local_98 = Vertices[uVar5 + 2];
    dStack_90 = Vertices[uVar5 + 3];
    auVar6._0_8_ = local_58 + local_78 + local_98;
    auVar6._8_8_ = dStack_50 + dStack_70 + dStack_90;
    dVar1 = local_48 + local_68 + local_88;
    auVar6 = vdppd_avx(auVar6,auVar6,0x31);
    dVar1 = dVar1 * dVar1 + auVar6._0_8_;
    if (dVar1 < 0.0) {
      sqrt(dVar1);
    }
    glNormal3dv(&local_58);
    glVertex3dv(uVar2 * 8 + 0x2ad858);
    glNormal3dv(&local_78);
    glVertex3dv(uVar3 * 8 + 0x2ad858);
    glNormal3dv(&local_98);
    glVertex3dv(uVar5 * 8 + 0x2ad858);
    glEnd();
  }
  glPopMatrix();
  return;
}

Assistant:

void draw_sphere(const Vector3D& p, double r) {
  if (!initialized) {
    init_mesh();
    initialized = true;
  }

  glMatrixMode(GL_MODELVIEW);
  glPushMatrix();
  glTranslated(p.x, p.y, p.z);
  glScaled(r, r, r);

  for (int i = 0; i < SPHERE_NUM_INDICES; i += 3) {
    glBegin(GL_POLYGON);
    double *vPtr1 = &Vertices[VERTEX_SIZE * Indices[i]];
    double *vPtr2 = &Vertices[VERTEX_SIZE * Indices[i + 1]];
    double *vPtr3 = &Vertices[VERTEX_SIZE * Indices[i + 2]];
    Vector3D n1(vPtr1[NORMAL_OFFSET],
                vPtr1[NORMAL_OFFSET + 1],
                vPtr1[NORMAL_OFFSET + 2]);
    Vector3D n2(vPtr2[NORMAL_OFFSET],
                vPtr2[NORMAL_OFFSET + 1],
                vPtr2[NORMAL_OFFSET + 2]);
    Vector3D n3(vPtr3[NORMAL_OFFSET],
                vPtr3[NORMAL_OFFSET + 1],
                vPtr3[NORMAL_OFFSET + 2]);
    const Vector3D& n = (n1 + n2 + n3).unit();
    glNormal3dv(&n1.x);
    glVertex3dv(vPtr1 + VERTEX_OFFSET);
    glNormal3dv(&n2.x);
    glVertex3dv(vPtr2 + VERTEX_OFFSET);
    glNormal3dv(&n3.x);
    glVertex3dv(vPtr3 + VERTEX_OFFSET);
    glEnd();
  }

  /*
  TODO: when I use this scratch code to render the mesh using the more efficient
        glDrawElements, it works for a single frame and then fails on all
        successive frames. Any opengl experts care to figure out why?
  glEnableClientState(GL_NORMAL_ARRAY);
  glEnableClientState(GL_VERTEX_ARRAY);
  glEnable(GL_NORMALIZE);
  for (int i = 0; i < SPHERE_NUM_VERTICES; i++) {
    normals[3 * i] = Vertices[8 * i + 2];
    normals[3 * i + 1] = Vertices[8 * i + 3];
    normals[3 * i + 2] = Vertices[8 * i + 4];
    vertices[3 * i] = Vertices[8 * i + 5];
    vertices[3 * i + 1] = Vertices[8 * i + 6];
    vertices[3 * i + 2] = Vertices[8 * i + 7];
  }

  glVertexPointer(3, GL_DOUBLE, 0, vertices);
  glNormalPointer(GL_DOUBLE, 0, normals);
  glDrawElements(GL_TRIANGLES, SPHERE_NUM_INDICES, GL_UNSIGNED_INT, Indices);
  */

  glPopMatrix();
}